

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O3

void __thiscall AllFloatsParseTest::RunShard(AllFloatsParseTest *this,int shard)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  float fVar4;
  undefined4 in_register_00000034;
  ulong uVar5;
  char *message;
  uint uVar6;
  uint uVar7;
  AssertionResult gtest_ar;
  uint32_t me;
  char buffer [100];
  float local_c4;
  Message local_c0;
  internal local_b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  uint32_t local_9c;
  char local_98 [104];
  
  uVar5 = CONCAT44(in_register_00000034,shard);
  uVar7 = 0xffffffff;
  local_c4 = (float)shard;
  do {
    if ((shard == 0) && (uVar6 = (uint)(uVar5 >> 0x18) & 0xff, uVar6 != uVar7)) {
      printf("value: 0x%08x (%d%%)\r",uVar5,
             (ulong)(uint)(int)(((double)(uVar5 & 0xffffffff) * 100.0) / 4294967295.0));
      fflush(_stdout);
      uVar5 = (ulong)(uint)local_c4;
      uVar7 = uVar6;
    }
    fVar4 = (float)uVar5;
    if ((~(uint)fVar4 & 0x7f800000) != 0) {
      iVar3 = snprintf(local_98,100,"%a",(double)fVar4);
      local_c0.ss_.ptr_._0_4_ = 0;
      local_a8.data_._0_4_ = wabt::ParseFloat(Hexfloat,local_98,local_98 + iVar3,&local_9c);
      testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                (local_b8,"Result::Ok",
                 "ParseFloat(LiteralType::Hexfloat, buffer, buffer + len, &me)",(Enum *)&local_c0,
                 (Result *)&local_a8);
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message(&local_c0);
        if (local_b0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_b0.ptr_)->_M_dataplus)._M_p;
        }
        iVar3 = 0x6e;
LAB_0011f307:
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
                   ,iVar3,message);
        testing::internal::AssertHelper::operator=(&local_a8,&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (((CONCAT44(local_c0.ss_.ptr_._4_4_,local_c0.ss_.ptr_._0_4_) != 0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           ((long *)CONCAT44(local_c0.ss_.ptr_._4_4_,local_c0.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_c0.ss_.ptr_._4_4_,local_c0.ss_.ptr_._0_4_) + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_b8,"me","bits",&local_9c,(uint *)&local_c4);
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message(&local_c0);
        if (local_b0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_b0.ptr_)->_M_dataplus)._M_p;
        }
        iVar3 = 0x6f;
        goto LAB_0011f307;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      fVar4 = local_c4;
    }
    piVar1 = &(this->super_ThreadedTest).num_threads_;
    local_c4 = (float)((int)fVar4 + *piVar1);
    uVar5 = (ulong)(uint)local_c4;
    if (CARRY4((uint)fVar4,*piVar1)) {
      if (shard == 0) {
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
  } while( true );
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      if (is_infinity_or_nan(bits))
        continue;

      float value = bit_cast<float>(bits);
      int len = snprintf(buffer, sizeof(buffer), "%a", value);

      uint32_t me;
      ASSERT_EQ(Result::Ok,
                ParseFloat(LiteralType::Hexfloat, buffer, buffer + len, &me));
      ASSERT_EQ(me, bits);
    }
    LOG_DONE();
  }